

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O2

void __thiscall
TestPluginManagerPathResolution_RespectsAbsolutePath_Plugin_Test::TestBody
          (TestPluginManagerPathResolution_RespectsAbsolutePath_Plugin_Test *this)

{
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *matcher;
  char *message;
  AssertionResult gtest_ar;
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  path local_b0;
  string local_88;
  string local_68 [32];
  string local_48 [32];
  string pluginFile;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pluginFile,"/path/to/some.plugin.so",(allocator<char> *)&local_b0);
  std::__cxx11::string::string(local_68,(string *)&pluginFile);
  std::__cxx11::string::string(local_48,local_68);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<std::__cxx11::string>>
            (&local_d0,(internal *)local_48,matcher);
  std::__cxx11::string::string((string *)&local_88,(string *)&pluginFile);
  plugin::PluginManager::ResolvePluginPath(&local_b0,&local_88);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::__cxx11::string>>::operator()
            (&gtest_ar,(char *)&local_d0,
             (path *)"plugin::PluginManager::ResolvePluginPath(pluginFile)");
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)local_b0._M_pathname._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b0._M_pathname._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&pluginFile);
  return;
}

Assistant:

TEST(TestPluginManagerPathResolution, RespectsAbsolutePath_Plugin)
{
    std::string pluginFile("/path/to/some.plugin.so");

    EXPECT_THAT(plugin::PluginManager::ResolvePluginPath(pluginFile), Eq(pluginFile));
}